

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O0

boolean get_sos(j_decompress_ptr cinfo)

{
  byte bVar1;
  byte bVar2;
  undefined8 *puVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  long *in_RDI;
  int *_mp_1;
  int *_mp;
  size_t bytes_in_buffer;
  JOCTET *next_input_byte;
  jpeg_source_mgr *datasrc;
  jpeg_component_info *compptr;
  int pi;
  int cc;
  int c;
  int n;
  int ci;
  int i;
  JLONG length;
  long local_50;
  byte *local_48;
  uint *local_38;
  int local_30;
  int local_20;
  int local_1c;
  
  puVar3 = (undefined8 *)in_RDI[5];
  local_48 = (byte *)*puVar3;
  local_50 = puVar3[1];
  if (*(int *)(in_RDI[0x49] + 0x1c) == 0) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x3e;
    (**(code **)*in_RDI)(in_RDI);
  }
  if (local_50 == 0) {
    iVar5 = (*(code *)puVar3[3])(in_RDI);
    if (iVar5 == 0) {
      return 0;
    }
    local_48 = (byte *)*puVar3;
    local_50 = puVar3[1];
  }
  local_50 = local_50 + -1;
  bVar1 = *local_48;
  local_48 = local_48 + 1;
  if (local_50 == 0) {
    iVar5 = (*(code *)puVar3[3])(in_RDI);
    if (iVar5 == 0) {
      return 0;
    }
    local_48 = (byte *)*puVar3;
    local_50 = puVar3[1];
  }
  local_50 = local_50 + -1;
  bVar2 = *local_48;
  local_48 = local_48 + 1;
  if (local_50 == 0) {
    iVar5 = (*(code *)puVar3[3])(in_RDI);
    if (iVar5 == 0) {
      return 0;
    }
    local_48 = (byte *)*puVar3;
    local_50 = puVar3[1];
  }
  uVar6 = (uint)*local_48;
  *(undefined4 *)(*in_RDI + 0x28) = 0x67;
  *(uint *)(*in_RDI + 0x2c) = uVar6;
  (**(code **)(*in_RDI + 8))(in_RDI,1);
  if ((((ulong)bVar2 + (ulong)bVar1 * 0x100 != (long)(int)(uVar6 * 2 + 6)) || (uVar6 == 0)) ||
     (4 < uVar6)) {
    *(undefined4 *)(*in_RDI + 0x28) = 0xb;
    (**(code **)*in_RDI)(in_RDI);
  }
  *(uint *)(in_RDI + 0x36) = uVar6;
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    in_RDI[(long)local_1c + 0x37] = 0;
  }
  local_1c = 0;
  do {
    local_48 = local_48 + 1;
    local_50 = local_50 + -1;
    if ((int)uVar6 <= local_1c) {
      if (local_50 == 0) {
        iVar5 = (*(code *)puVar3[3])(in_RDI);
        if (iVar5 == 0) {
          return 0;
        }
        local_48 = (byte *)*puVar3;
        local_50 = puVar3[1];
      }
      local_50 = local_50 + -1;
      *(uint *)((long)in_RDI + 0x20c) = (uint)*local_48;
      local_48 = local_48 + 1;
      if (local_50 == 0) {
        iVar5 = (*(code *)puVar3[3])(in_RDI);
        if (iVar5 == 0) {
          return 0;
        }
        local_48 = (byte *)*puVar3;
        local_50 = puVar3[1];
      }
      local_50 = local_50 + -1;
      *(uint *)(in_RDI + 0x42) = (uint)*local_48;
      local_48 = local_48 + 1;
      if (local_50 == 0) {
        iVar5 = (*(code *)puVar3[3])(in_RDI);
        if (iVar5 == 0) {
          return 0;
        }
        local_48 = (byte *)*puVar3;
        local_50 = puVar3[1];
      }
      bVar1 = *local_48;
      *(int *)((long)in_RDI + 0x214) = (int)(uint)bVar1 >> 4;
      *(uint *)(in_RDI + 0x43) = bVar1 & 0xf;
      lVar4 = *in_RDI;
      *(undefined4 *)(lVar4 + 0x2c) = *(undefined4 *)((long)in_RDI + 0x20c);
      *(int *)(lVar4 + 0x30) = (int)in_RDI[0x42];
      *(undefined4 *)(lVar4 + 0x34) = *(undefined4 *)((long)in_RDI + 0x214);
      *(int *)(lVar4 + 0x38) = (int)in_RDI[0x43];
      *(undefined4 *)(*in_RDI + 0x28) = 0x69;
      (**(code **)(*in_RDI + 8))(in_RDI,1);
      *(undefined4 *)(in_RDI[0x49] + 0x20) = 0;
      *(int *)((long)in_RDI + 0xac) = *(int *)((long)in_RDI + 0xac) + 1;
      *puVar3 = local_48 + 1;
      puVar3[1] = local_50 + -1;
      return 1;
    }
    if (local_50 == 0) {
      iVar5 = (*(code *)puVar3[3])(in_RDI);
      if (iVar5 == 0) {
        return 0;
      }
      local_48 = (byte *)*puVar3;
      local_50 = puVar3[1];
    }
    local_50 = local_50 + -1;
    uVar7 = (uint)*local_48;
    local_48 = local_48 + 1;
    if (local_50 == 0) {
      iVar5 = (*(code *)puVar3[3])(in_RDI);
      if (iVar5 == 0) {
        return 0;
      }
      local_48 = (byte *)*puVar3;
      local_50 = puVar3[1];
    }
    bVar1 = *local_48;
    local_20 = 0;
    local_38 = (uint *)in_RDI[0x26];
    for (; local_20 < (int)in_RDI[7] && local_20 < 4; local_20 = local_20 + 1) {
      if ((uVar7 == *local_38) && (in_RDI[(long)local_20 + 0x37] == 0)) goto LAB_00151806;
      local_38 = local_38 + 0x18;
    }
    *(undefined4 *)(*in_RDI + 0x28) = 5;
    *(uint *)(*in_RDI + 0x2c) = uVar7;
    (**(code **)*in_RDI)(in_RDI);
LAB_00151806:
    in_RDI[(long)local_1c + 0x37] = (long)local_38;
    local_38[5] = (int)(uint)bVar1 >> 4;
    local_38[6] = bVar1 & 0xf;
    lVar4 = *in_RDI;
    *(uint *)(lVar4 + 0x2c) = uVar7;
    *(uint *)(lVar4 + 0x30) = local_38[5];
    *(uint *)(lVar4 + 0x34) = local_38[6];
    *(undefined4 *)(*in_RDI + 0x28) = 0x68;
    (**(code **)(*in_RDI + 8))(in_RDI,1);
    for (local_30 = 0; local_30 < local_1c; local_30 = local_30 + 1) {
      if ((uint *)in_RDI[(long)local_30 + 0x37] == local_38) {
        *(undefined4 *)(*in_RDI + 0x28) = 5;
        *(uint *)(*in_RDI + 0x2c) = uVar7;
        (**(code **)*in_RDI)(in_RDI);
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

LOCAL(boolean)
get_sos(j_decompress_ptr cinfo)
/* Process a SOS marker */
{
  JLONG length;
  int i, ci, n, c, cc, pi;
  jpeg_component_info *compptr;
  INPUT_VARS(cinfo);

  if (!cinfo->marker->saw_SOF)
    ERREXIT(cinfo, JERR_SOS_NO_SOF);

  INPUT_2BYTES(cinfo, length, return FALSE);

  INPUT_BYTE(cinfo, n, return FALSE); /* Number of components */

  TRACEMS1(cinfo, 1, JTRC_SOS, n);

  if (length != (n * 2 + 6) || n < 1 || n > MAX_COMPS_IN_SCAN)
    ERREXIT(cinfo, JERR_BAD_LENGTH);

  cinfo->comps_in_scan = n;

  /* Collect the component-spec parameters */

  for (i = 0; i < MAX_COMPS_IN_SCAN; i++)
    cinfo->cur_comp_info[i] = NULL;

  for (i = 0; i < n; i++) {
    INPUT_BYTE(cinfo, cc, return FALSE);
    INPUT_BYTE(cinfo, c, return FALSE);

    for (ci = 0, compptr = cinfo->comp_info;
         ci < cinfo->num_components && ci < MAX_COMPS_IN_SCAN;
         ci++, compptr++) {
      if (cc == compptr->component_id && !cinfo->cur_comp_info[ci])
        goto id_found;
    }

    ERREXIT1(cinfo, JERR_BAD_COMPONENT_ID, cc);

id_found:

    cinfo->cur_comp_info[i] = compptr;
    compptr->dc_tbl_no = (c >> 4) & 15;
    compptr->ac_tbl_no = (c     ) & 15;

    TRACEMS3(cinfo, 1, JTRC_SOS_COMPONENT, cc,
             compptr->dc_tbl_no, compptr->ac_tbl_no);

    /* This CSi (cc) should differ from the previous CSi */
    for (pi = 0; pi < i; pi++) {
      if (cinfo->cur_comp_info[pi] == compptr) {
        ERREXIT1(cinfo, JERR_BAD_COMPONENT_ID, cc);
      }
    }
  }

  /* Collect the additional scan parameters Ss, Se, Ah/Al. */
  INPUT_BYTE(cinfo, c, return FALSE);
  cinfo->Ss = c;
  INPUT_BYTE(cinfo, c, return FALSE);
  cinfo->Se = c;
  INPUT_BYTE(cinfo, c, return FALSE);
  cinfo->Ah = (c >> 4) & 15;
  cinfo->Al = (c     ) & 15;

  TRACEMS4(cinfo, 1, JTRC_SOS_PARAMS, cinfo->Ss, cinfo->Se,
           cinfo->Ah, cinfo->Al);

  /* Prepare to scan data & restart markers */
  cinfo->marker->next_restart_num = 0;

  /* Count another SOS marker */
  cinfo->input_scan_number++;

  INPUT_SYNC(cinfo);
  return TRUE;
}